

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaD_reallocstack(lua_State *L,int newsize)

{
  StkId block;
  CallInfo *pCVar1;
  GCObject **ppGVar2;
  StkId pTVar3;
  GCObject *pGVar4;
  CallInfo *pCVar5;
  
  if (-8 < newsize) {
    block = L->stack;
    pTVar3 = (StkId)luaM_realloc_(L,block,(long)L->stacksize << 4,(long)newsize * 0x10 + 0x60);
    L->stack = pTVar3;
    L->stacksize = newsize + 6;
    L->stack_last = pTVar3 + newsize;
    L->top = (StkId)(((long)L->top - (long)block) + (long)pTVar3);
    pGVar4 = L->openupval;
    if (L->openupval != (GCObject *)0x0) {
      do {
        ppGVar2 = &(pGVar4->gch).next;
        (pGVar4->h).metatable =
             (Table *)(((long)(pGVar4->h).metatable - (long)block) + (long)L->stack);
        pGVar4 = *ppGVar2;
      } while (*ppGVar2 != (GCObject *)0x0);
      pTVar3 = L->stack;
    }
    pCVar1 = L->ci;
    for (pCVar5 = L->base_ci; pCVar5 <= pCVar1; pCVar5 = pCVar5 + 1) {
      pCVar5->top = (StkId)(((long)pCVar5->top - (long)block) + (long)pTVar3);
      pCVar5->base = (StkId)(((long)pCVar5->base - (long)block) + (long)pTVar3);
      pCVar5->func = (StkId)(((long)pCVar5->func - (long)block) + (long)pTVar3);
    }
    L->base = (StkId)((long)pTVar3 + ((long)L->base - (long)block));
    return;
  }
  luaG_runerror(L,"memory allocation error: block too big");
}

Assistant:

static void luaD_reallocstack(lua_State*L,int newsize){
TValue*oldstack=L->stack;
int realsize=newsize+1+5;
luaM_reallocvector(L,L->stack,L->stacksize,realsize,TValue);
L->stacksize=realsize;
L->stack_last=L->stack+newsize;
correctstack(L,oldstack);
}